

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternmodifier.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::ImmutablePatternModifier::applyToMicros
          (ImmutablePatternModifier *this,MicroProps *micros,DecimalQuantity *quantity)

{
  int8_t iVar1;
  Form FVar2;
  int iVar3;
  AdoptingModifierStore *pAVar4;
  Modifier *pMVar5;
  undefined4 extraout_var;
  undefined8 in_RCX;
  Form plural;
  undefined1 local_70 [8];
  DecimalQuantity copy;
  DecimalQuantity *quantity_local;
  MicroProps *micros_local;
  ImmutablePatternModifier *this_local;
  
  copy._72_8_ = quantity;
  if (this->rules == (PluralRules *)0x0) {
    pAVar4 = LocalPointerBase<icu_63::number::impl::AdoptingModifierStore>::operator->
                       (&(this->pm).
                         super_LocalPointerBase<icu_63::number::impl::AdoptingModifierStore>);
    iVar1 = DecimalQuantity::signum((DecimalQuantity *)copy._72_8_);
    pMVar5 = AdoptingModifierStore::getModifierWithoutPlural(pAVar4,iVar1);
    micros->modMiddle = pMVar5;
  }
  else {
    DecimalQuantity::DecimalQuantity((DecimalQuantity *)local_70,quantity);
    DecimalQuantity::roundToInfinity((DecimalQuantity *)local_70);
    FVar2 = utils::getStandardPlural(this->rules,(IFixedDecimal *)local_70);
    pAVar4 = LocalPointerBase<icu_63::number::impl::AdoptingModifierStore>::operator->
                       (&(this->pm).
                         super_LocalPointerBase<icu_63::number::impl::AdoptingModifierStore>);
    iVar1 = DecimalQuantity::signum((DecimalQuantity *)copy._72_8_);
    iVar3 = (*(pAVar4->super_ModifierStore)._vptr_ModifierStore[2])
                      (pAVar4,(ulong)(uint)(int)iVar1,(ulong)FVar2,
                       CONCAT71((int7)((ulong)in_RCX >> 8),iVar1));
    micros->modMiddle = (Modifier *)CONCAT44(extraout_var,iVar3);
    DecimalQuantity::~DecimalQuantity((DecimalQuantity *)local_70);
  }
  return;
}

Assistant:

void ImmutablePatternModifier::applyToMicros(MicroProps& micros, DecimalQuantity& quantity) const {
    if (rules == nullptr) {
        micros.modMiddle = pm->getModifierWithoutPlural(quantity.signum());
    } else {
        // TODO: Fix this. Avoid the copy.
        DecimalQuantity copy(quantity);
        copy.roundToInfinity();
        StandardPlural::Form plural = utils::getStandardPlural(rules, copy);
        micros.modMiddle = pm->getModifier(quantity.signum(), plural);
    }
}